

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O2

void __thiscall bandit::detail::spec_reporter::it_succeeded(spec_reporter *this,char *desc)

{
  int *piVar1;
  char *pcVar2;
  
  piVar1 = &(this->super_progress_reporter).specs_succeeded_;
  *piVar1 = *piVar1 + 1;
  pcVar2 = "\x1b[1;32m";
  if (this->colorizer_->colors_enabled_ == false) {
    pcVar2 = "";
  }
  std::operator<<(this->stm_,pcVar2);
  std::operator<<(this->stm_,"OK");
  pcVar2 = "\x1b[0m";
  if (this->colorizer_->colors_enabled_ == false) {
    pcVar2 = "";
  }
  std::operator<<(this->stm_,pcVar2);
  std::endl<char,std::char_traits<char>>(this->stm_);
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_succeeded(const char* desc)
    {
      progress_reporter::it_succeeded(desc);
      stm_ << colorizer_.green();
	  stm_ << "OK";
	  stm_ << colorizer_.reset();
	  stm_ << std::endl;
      stm_.flush();
    }